

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_TestTwoBoundaryFiles::_Run(_Test_TestTwoBoundaryFiles *this)

{
  FileMetaData *pFVar1;
  reference ppFVar2;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  Tester local_7e8;
  Tester local_648;
  Tester local_4a8;
  size_type local_308;
  int local_2fc;
  Tester local_2f8;
  Slice local_158;
  InternalKey local_148;
  Slice local_128;
  InternalKey local_118;
  FileMetaData *local_f8;
  FileMetaData *f3;
  InternalKey local_e0;
  Slice local_c0;
  InternalKey local_b0;
  FileMetaData *local_90;
  FileMetaData *f2;
  Slice local_78;
  InternalKey local_68;
  Slice local_48;
  InternalKey local_38;
  FileMetaData *local_18;
  FileMetaData *f1;
  _Test_TestTwoBoundaryFiles *this_local;
  
  f1 = (FileMetaData *)this;
  Slice::Slice(&local_48,"100");
  InternalKey::InternalKey(&local_38,&local_48,6,kTypeValue);
  Slice::Slice(&local_78,"100");
  InternalKey::InternalKey(&local_68,&local_78,5,kTypeValue);
  pFVar1 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_38,&local_68);
  InternalKey::~InternalKey(&local_68);
  InternalKey::~InternalKey(&local_38);
  local_18 = pFVar1;
  Slice::Slice(&local_c0,"100");
  InternalKey::InternalKey(&local_b0,&local_c0,2,kTypeValue);
  Slice::Slice((Slice *)&f3,"300");
  InternalKey::InternalKey(&local_e0,(Slice *)&f3,1,kTypeValue);
  pFVar1 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_b0,&local_e0);
  InternalKey::~InternalKey(&local_e0);
  InternalKey::~InternalKey(&local_b0);
  local_90 = pFVar1;
  Slice::Slice(&local_128,"100");
  InternalKey::InternalKey(&local_118,&local_128,4,kTypeValue);
  Slice::Slice(&local_158,"100");
  InternalKey::InternalKey(&local_148,&local_158,3,kTypeValue);
  pFVar1 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_118,&local_148);
  InternalKey::~InternalKey(&local_148);
  InternalKey::~InternalKey(&local_118);
  local_f8 = pFVar1;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this,
             &local_90);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this,
             &local_f8);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this,
             &local_18);
  this_00 = &(this->super_AddBoundaryInputsTest).compaction_files_;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            (this_00,&local_18);
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    this,this_00);
  test::Tester::Tester
            (&local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x129);
  local_2fc = 3;
  local_308 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (this_00);
  test::Tester::IsEq<int,unsigned_long>(&local_2f8,&local_2fc,&local_308);
  test::Tester::~Tester(&local_2f8);
  test::Tester::Tester
            (&local_4a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x12a);
  ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            operator[](&(this->super_AddBoundaryInputsTest).compaction_files_,0);
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>(&local_4a8,&local_18,ppFVar2);
  test::Tester::~Tester(&local_4a8);
  test::Tester::Tester
            (&local_648,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,299);
  ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            operator[](&(this->super_AddBoundaryInputsTest).compaction_files_,1);
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>(&local_648,&local_f8,ppFVar2);
  test::Tester::~Tester(&local_648);
  test::Tester::Tester
            (&local_7e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,300);
  ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            operator[](&(this->super_AddBoundaryInputsTest).compaction_files_,2);
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>(&local_7e8,&local_90,ppFVar2);
  test::Tester::~Tester(&local_7e8);
  return;
}

Assistant:

TEST(AddBoundaryInputsTest, TestTwoBoundaryFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 6, kTypeValue),
                         InternalKey(InternalKey("100", 5, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("100", 4, kTypeValue),
                         InternalKey(InternalKey("100", 3, kTypeValue)));

  level_files_.push_back(f2);
  level_files_.push_back(f3);
  level_files_.push_back(f1);
  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(3, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_EQ(f3, compaction_files_[1]);
  ASSERT_EQ(f2, compaction_files_[2]);
}